

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  long lVar2;
  
  if (0 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar2 = 0;
    do {
      bVar1 = AddNestedExtensions(this,(DescriptorProto *)
                                       (message_type->nested_type_).super_RepeatedPtrFieldBase.
                                       elements_[lVar2],value);
      if (!bVar1) {
        return false;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((message_type->extension_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar1 = true;
  }
  else {
    lVar2 = 0;
    do {
      bVar1 = AddExtension(this,(FieldDescriptorProto *)
                                (message_type->extension_).super_RepeatedPtrFieldBase.elements_
                                [lVar2],value);
      if (!bVar1) {
        return bVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (message_type->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(message_type.nested_type(i), value)) return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(message_type.extension(i), value)) return false;
  }
  return true;
}